

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_snprintf(int n,char *zBuf,char *zFormat,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [20];
  undefined1 *puStack_44;
  undefined4 uStack_3c;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_18;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Da;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_4_ = 0xaaaaaaaa;
  puStack_44 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_3c._0_1_ = 0xaa;
  uStack_3c._1_1_ = 0xaa;
  uStack_3c._2_2_ = 0xaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  if (0 < n) {
    local_58._0_8_ = (sqlite3 *)0x0;
    puStack_44 = (undefined1 *)0x0;
    uStack_3c._0_1_ = '\0';
    uStack_3c._1_1_ = '\0';
    uStack_3c._2_2_ = 0xaaaa;
    local_38 = (undefined1 *)0x3000000018;
    puStack_30 = &stack0x00000008;
    local_58._8_8_ = zBuf;
    local_58._16_4_ = n;
    local_28 = auStack_108;
    sqlite3_str_vappendf((sqlite3_str *)local_58,zFormat,(__va_list_tag *)&local_38);
    zBuf[(ulong)puStack_44 >> 0x20] = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return zBuf;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API char *sqlite3_snprintf(int n, char *zBuf, const char *zFormat, ...){
  StrAccum acc;
  va_list ap;
  if( n<=0 ) return zBuf;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( zBuf==0 || zFormat==0 ) {
    (void)SQLITE_MISUSE_BKPT;
    if( zBuf ) zBuf[0] = 0;
    return zBuf;
  }
#endif
  sqlite3StrAccumInit(&acc, 0, zBuf, n, 0);
  va_start(ap,zFormat);
  sqlite3_str_vappendf(&acc, zFormat, ap);
  va_end(ap);
  zBuf[acc.nChar] = 0;
  return zBuf;
}